

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_check_mandatory_data
              (lyd_node *root,lyd_node *last_parent,ly_set *instances,lys_node *schema,int options)

{
  LYS_NODE LVar1;
  uint uVar2;
  ly_ctx *ctx_00;
  char *pcVar3;
  ushort uVar4;
  int iVar5;
  lys_node *plVar6;
  lys_module *plVar7;
  char *local_70;
  uint16_t status;
  uint32_t limit;
  ly_ctx *ctx;
  int options_local;
  lys_node *schema_local;
  ly_set *instances_local;
  lyd_node *last_parent_local;
  lyd_node *root_local;
  
  ctx_00 = schema->module->ctx;
  if (instances->number == 0) {
    uVar4 = schema->flags & 0x38;
    plVar6 = lys_is_disabled(schema,2);
    if ((plVar6 != (lys_node *)0x0) || ((uVar4 != 0 && (uVar4 != 8)))) {
      return 0;
    }
    if (((options & 0x2000U) != 0) || (((options & 0x10000ffU) != 0 && ((schema->flags & 2) != 0))))
    {
      return 0;
    }
    iVar5 = lyd_is_when_false(root,last_parent,schema,options);
    if (iVar5 != 0) {
      return 0;
    }
  }
  LVar1 = schema->nodetype;
  if (LVar1 != LYS_LEAF) {
    if (LVar1 == LYS_LEAFLIST) {
      if ((*(uint *)&schema[1].priv != 0) && (instances->number < *(uint *)&schema[1].priv)) {
        ly_vlog(ctx_00,LYE_NOMIN,LY_VLOG_LYD,last_parent,schema->name);
        return 1;
      }
      uVar2 = *(uint *)((long)&schema[1].priv + 4);
      if (uVar2 == 0) {
        return 0;
      }
      if (instances->number <= uVar2) {
        return 0;
      }
      ly_vlog(ctx_00,LYE_NOMAX,LY_VLOG_LYD,(instances->set).s[uVar2],schema->name);
      return 1;
    }
    if (LVar1 == LYS_LIST) {
      if ((*(uint *)&schema[1].iffeature != 0) &&
         (instances->number < *(uint *)&schema[1].iffeature)) {
        ly_vlog(ctx_00,LYE_NOMIN,LY_VLOG_LYD,last_parent,schema->name);
        return 1;
      }
      uVar2 = *(uint *)((long)&schema[1].iffeature + 4);
      if (uVar2 == 0) {
        return 0;
      }
      if (instances->number <= uVar2) {
        return 0;
      }
      ly_vlog(ctx_00,LYE_NOMAX,LY_VLOG_LYD,(instances->set).s[uVar2],schema->name);
      return 1;
    }
    if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x2a1,
                    "int lyd_check_mandatory_data(struct lyd_node *, struct lyd_node *, struct ly_set *, struct lys_node *, int)"
                   );
    }
  }
  if (((schema->flags & 0x40) != 0) && (instances->number == 0)) {
    pcVar3 = schema->name;
    if (last_parent == (lyd_node *)0x0) {
      plVar7 = lys_node_module(schema);
      local_70 = plVar7->name;
    }
    else {
      local_70 = last_parent->schema->name;
    }
    ly_vlog(ctx_00,LYE_MISSELEM,LY_VLOG_LYD,last_parent,pcVar3,local_70);
    return 1;
  }
  return 0;
}

Assistant:

static int
lyd_check_mandatory_data(struct lyd_node *root, struct lyd_node *last_parent,
                         struct ly_set *instances, struct lys_node *schema, int options)
{
    struct ly_ctx *ctx = schema->module->ctx;
    uint32_t limit;
    uint16_t status;

    if (!instances->number) {
        /* no instance in the data tree - check if the instantiating is enabled
         * (check: if-feature, when, status data in non-status data tree)
         */
        status = (schema->flags & LYS_STATUS_MASK);
        if (lys_is_disabled(schema, 2) || (status && status != LYS_STATUS_CURR)) {
            /* disabled by if-feature */
            return EXIT_SUCCESS;
        } else if ((options & LYD_OPT_TRUSTED) || ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R))) {
            /* status schema node in non-status data tree */
            return EXIT_SUCCESS;
        } else if (lyd_is_when_false(root, last_parent, schema, options)) {
            return EXIT_SUCCESS;
        }
        /* the schema instance is not disabled by anything, continue with checking */
    }

    /* checking various mandatory conditions */
    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* mandatory */
        if ((schema->flags & LYS_MAND_TRUE) && !instances->number) {
            LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, last_parent, schema->name,
                   last_parent ? last_parent->schema->name : lys_node_module(schema)->name);
            return EXIT_FAILURE;
        }
        break;
    case LYS_LIST:
        /* min-elements */
        limit = ((struct lys_node_list *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(ctx, LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_list *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(ctx, LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }

        break;

    case LYS_LEAFLIST:
        /* min-elements */
        limit = ((struct lys_node_leaflist *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(ctx, LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_leaflist *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(ctx, LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }
        break;
    default:
        /* we cannot get here */
        assert(0);
        break;
    }

    return EXIT_SUCCESS;
}